

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O1

RationalConstantType * __thiscall
Kernel::RationalConstantType::operator/
          (RationalConstantType *__return_storage_ptr__,RationalConstantType *this,
          RationalConstantType *o)

{
  RationalConstantType rhs;
  RationalConstantType lhs;
  IntegerConstantType local_80;
  IntegerConstantType local_70;
  IntegerConstantType local_60;
  IntegerConstantType local_50;
  IntegerConstantType local_40;
  IntegerConstantType local_30;
  
  IntegerConstantType::IntegerConstantType(&local_60,&this->_num);
  IntegerConstantType::IntegerConstantType(&local_50,&this->_den);
  IntegerConstantType::IntegerConstantType(&local_80,&o->_num);
  IntegerConstantType::IntegerConstantType(&local_70,&o->_den);
  IntegerConstantType::operator*(&local_30,&local_60);
  IntegerConstantType::operator*(&local_40,&local_50);
  RationalConstantType(__return_storage_ptr__,&local_30,&local_40);
  if ((long)local_40._val[0]._mp_alloc != 0) {
    (*gmp_free_func)(local_40._val[0]._mp_d,(long)local_40._val[0]._mp_alloc << 3);
  }
  if ((long)local_30._val[0]._mp_alloc != 0) {
    (*gmp_free_func)(local_30._val[0]._mp_d,(long)local_30._val[0]._mp_alloc << 3);
  }
  if ((long)local_70._val[0]._mp_alloc != 0) {
    (*gmp_free_func)(local_70._val[0]._mp_d,(long)local_70._val[0]._mp_alloc << 3);
  }
  if ((long)local_80._val[0]._mp_alloc != 0) {
    (*gmp_free_func)(local_80._val[0]._mp_d,(long)local_80._val[0]._mp_alloc << 3);
  }
  if ((long)local_50._val[0]._mp_alloc != 0) {
    (*gmp_free_func)(local_50._val[0]._mp_d,(long)local_50._val[0]._mp_alloc << 3);
  }
  if ((long)local_60._val[0]._mp_alloc != 0) {
    (*gmp_free_func)(local_60._val[0]._mp_d,(long)local_60._val[0]._mp_alloc << 3);
  }
  return __return_storage_ptr__;
}

Assistant:

RationalConstantType RationalConstantType::operator/(const RationalConstantType& o) const
{
  auto lhs = *this;
  auto rhs = o;
  return RationalConstantType(
      lhs._num * rhs._den, 
      lhs._den * rhs._num);
}